

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O1

void __thiscall CMU462::PathTracer::build_accel(PathTracer *this)

{
  iterator *piVar1;
  pointer ppSVar2;
  _Elt_pointer ppBVar3;
  rep rVar4;
  long lVar5;
  BVHAccel *this_00;
  pointer ppSVar6;
  vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
  primitives;
  vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
  local_68;
  BVHNode *local_48;
  long local_40;
  
  fwrite("[PathTracer] Collecting primitives... ",0x26,1,_stdout);
  fflush(_stdout);
  rVar4 = std::chrono::_V2::steady_clock::now();
  (this->timer).t0.__d.__r = rVar4;
  local_68.
  super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppSVar6 = (this->scene->objects).
            super__Vector_base<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppSVar2 = (this->scene->objects).
            super__Vector_base<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppSVar6 != ppSVar2) {
    do {
      (**(*ppSVar6)->_vptr_SceneObject)(&local_48);
      std::
      vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>::
      reserve(&local_68,
              (local_40 - (long)local_48 >> 3) +
              ((long)local_68.
                     super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_68.
                     super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3));
      std::vector<CMU462::StaticScene::Primitive*,std::allocator<CMU462::StaticScene::Primitive*>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<CMU462::StaticScene::Primitive*const*,std::vector<CMU462::StaticScene::Primitive*,std::allocator<CMU462::StaticScene::Primitive*>>>>
                ((vector<CMU462::StaticScene::Primitive*,std::allocator<CMU462::StaticScene::Primitive*>>
                  *)&local_68,
                 local_68.
                 super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,local_48,local_40);
      if (local_48 != (BVHNode *)0x0) {
        operator_delete(local_48);
      }
      ppSVar6 = ppSVar6 + 1;
    } while (ppSVar6 != ppSVar2);
  }
  lVar5 = std::chrono::_V2::steady_clock::now();
  (this->timer).t1.__d.__r = lVar5;
  fprintf(_stdout,"Done! (%.4f sec)\n",
          SUB84((double)(lVar5 - (this->timer).t0.__d.__r) / 1000000000.0,0));
  fwrite("[PathTracer] Building BVH... ",0x1d,1,_stdout);
  fflush(_stdout);
  rVar4 = std::chrono::_V2::steady_clock::now();
  (this->timer).t0.__d.__r = rVar4;
  this_00 = (BVHAccel *)operator_new(0x28);
  StaticScene::BVHAccel::BVHAccel(this_00,&local_68,4);
  this->bvh = this_00;
  lVar5 = std::chrono::_V2::steady_clock::now();
  (this->timer).t1.__d.__r = lVar5;
  fprintf(_stdout,"Done! (%.4f sec)\n",
          SUB84((double)(lVar5 - (this->timer).t0.__d.__r) / 1000000000.0,0));
  local_48 = this->bvh->root;
  ppBVar3 = (this->selectionHistory).c.
            super__Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppBVar3 ==
      (this->selectionHistory).c.
      super__Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<CMU462::StaticScene::BVHNode*,std::allocator<CMU462::StaticScene::BVHNode*>>::
    _M_push_back_aux<CMU462::StaticScene::BVHNode*>
              ((deque<CMU462::StaticScene::BVHNode*,std::allocator<CMU462::StaticScene::BVHNode*>> *
               )&this->selectionHistory,&local_48);
  }
  else {
    *ppBVar3 = local_48;
    piVar1 = &(this->selectionHistory).c.
              super__Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
              ._M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  if (local_68.
      super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PathTracer::build_accel() {
  // collect primitives //
  fprintf(stdout, "[PathTracer] Collecting primitives... ");
  fflush(stdout);
  timer.start();
  vector<Primitive *> primitives;
  for (SceneObject *obj : scene->objects) {
    const vector<Primitive *> &obj_prims = obj->get_primitives();
    primitives.reserve(primitives.size() + obj_prims.size());
    primitives.insert(primitives.end(), obj_prims.begin(), obj_prims.end());
  }
  timer.stop();
  fprintf(stdout, "Done! (%.4f sec)\n", timer.duration());

  // build BVH //
  fprintf(stdout, "[PathTracer] Building BVH... ");
  fflush(stdout);
  timer.start();
  bvh = new BVHAccel(primitives);
  timer.stop();
  fprintf(stdout, "Done! (%.4f sec)\n", timer.duration());

  // initial visualization //
  selectionHistory.push(bvh->get_root());
}